

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteDTDExternalEntityContents
              (xmlTextWriterPtr writer,xmlChar *pubid,xmlChar *sysid,xmlChar *ndataid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlLinkPtr lk_00;
  void *pvVar5;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlChar *ndataid_local;
  xmlChar *sysid_local;
  xmlChar *pubid_local;
  xmlTextWriterPtr writer_local;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "xmlTextWriterWriteDTDExternalEntityContents: xmlTextWriterPtr invalid!\n");
    writer_local._4_4_ = -1;
  }
  else {
    lk._0_4_ = 0;
    lk_00 = xmlListFront(writer->nodes);
    if (lk_00 == (xmlLinkPtr)0x0) {
      xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,
                      "xmlTextWriterWriteDTDExternalEntityContents: you must call xmlTextWriterStartDTDEntity before the call to this function!\n"
                     );
      writer_local._4_4_ = -1;
    }
    else {
      pvVar5 = xmlLinkGetData(lk_00);
      if (pvVar5 == (void *)0x0) {
        writer_local._4_4_ = -1;
      }
      else {
        if (*(int *)((long)pvVar5 + 8) != 0xd) {
          if (*(int *)((long)pvVar5 + 8) != 0xf) {
            xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,
                            "xmlTextWriterWriteDTDExternalEntityContents: you must call xmlTextWriterStartDTDEntity before the call to this function!\n"
                           );
            return -1;
          }
          if (ndataid != (xmlChar *)0x0) {
            xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,
                            "xmlTextWriterWriteDTDExternalEntityContents: notation not allowed with parameter entities!\n"
                           );
            return -1;
          }
        }
        if (pubid != (xmlChar *)0x0) {
          if (sysid == (xmlChar *)0x0) {
            xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,
                            "xmlTextWriterWriteDTDExternalEntityContents: system identifier needed!\n"
                           );
            return -1;
          }
          iVar1 = xmlOutputBufferWriteString(writer->out," PUBLIC ");
          if (iVar1 < 0) {
            return -1;
          }
          iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
          if (iVar2 < 0) {
            return -1;
          }
          iVar3 = xmlOutputBufferWriteString(writer->out,(char *)pubid);
          if (iVar3 < 0) {
            return -1;
          }
          iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
          if (iVar4 < 0) {
            return -1;
          }
          lk._0_4_ = iVar4 + iVar3 + iVar2 + iVar1;
        }
        if (sysid != (xmlChar *)0x0) {
          if (pubid == (xmlChar *)0x0) {
            iVar1 = xmlOutputBufferWriteString(writer->out," SYSTEM");
            if (iVar1 < 0) {
              return -1;
            }
            lk._0_4_ = iVar1 + (int)lk;
          }
          iVar1 = xmlOutputBufferWriteString(writer->out," ");
          if (iVar1 < 0) {
            return -1;
          }
          iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
          if (iVar2 < 0) {
            return -1;
          }
          iVar3 = xmlOutputBufferWriteString(writer->out,(char *)sysid);
          if (iVar3 < 0) {
            return -1;
          }
          iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
          if (iVar4 < 0) {
            return -1;
          }
          lk._0_4_ = iVar4 + iVar3 + iVar2 + iVar1 + (int)lk;
        }
        if (ndataid != (xmlChar *)0x0) {
          iVar1 = xmlOutputBufferWriteString(writer->out," NDATA ");
          if (iVar1 < 0) {
            return -1;
          }
          iVar2 = xmlOutputBufferWriteString(writer->out,(char *)ndataid);
          if (iVar2 < 0) {
            return -1;
          }
          lk._0_4_ = iVar2 + iVar1 + (int)lk;
        }
        writer_local._4_4_ = (int)lk;
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteDTDExternalEntityContents(xmlTextWriterPtr writer,
                                            const xmlChar * pubid,
                                            const xmlChar * sysid,
                                            const xmlChar * ndataid)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterWriteDTDExternalEntityContents: xmlTextWriterPtr invalid!\n");
        return -1;
    }

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk == 0) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterWriteDTDExternalEntityContents: you must call xmlTextWriterStartDTDEntity before the call to this function!\n");
        return -1;
    }

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return -1;

    switch (p->state) {
        case XML_TEXTWRITER_DTD_ENTY:
            break;
        case XML_TEXTWRITER_DTD_PENT:
            if (ndataid != NULL) {
                xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                                "xmlTextWriterWriteDTDExternalEntityContents: notation not allowed with parameter entities!\n");
                return -1;
            }
            break;
        default:
            xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                            "xmlTextWriterWriteDTDExternalEntityContents: you must call xmlTextWriterStartDTDEntity before the call to this function!\n");
            return -1;
    }

    if (pubid != 0) {
        if (sysid == 0) {
            xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                            "xmlTextWriterWriteDTDExternalEntityContents: system identifier needed!\n");
            return -1;
        }

        count = xmlOutputBufferWriteString(writer->out, " PUBLIC ");
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out, (const char *) pubid);
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (sysid != 0) {
        if (pubid == 0) {
            count = xmlOutputBufferWriteString(writer->out, " SYSTEM");
            if (count < 0)
                return -1;
            sum += count;
        }

        count = xmlOutputBufferWriteString(writer->out, " ");
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out, (const char *) sysid);
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (ndataid != NULL) {
        count = xmlOutputBufferWriteString(writer->out, " NDATA ");
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out,
                                       (const char *) ndataid);
        if (count < 0)
            return -1;
        sum += count;
    }

    return sum;
}